

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void Cmd_echo(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *in_RAX;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  FString formatted;
  FString local_38;
  
  local_38.Chars = in_RAX;
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    iVar3 = 2;
    do {
      FCommandLine::operator[](argv,iVar3 + -1);
      strbin1((char *)&local_38);
      pcVar2 = " ";
      if (iVar3 == iVar1) {
        pcVar2 = "\n";
      }
      Printf("%s%s",local_38.Chars,pcVar2);
      FString::~FString(&local_38);
      bVar4 = iVar3 != iVar1;
      iVar3 = iVar3 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

CCMD (echo)
{
	int last = argv.argc()-1;
	for (int i = 1; i <= last; ++i)
	{
		FString formatted = strbin1 (argv[i]);
		Printf ("%s%s", formatted.GetChars(), i!=last ? " " : "\n");
	}
}